

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O1

Expression * __thiscall
wasm::MultiMemoryLowering::Replacer::makePtrBoundsCheck<wasm::AtomicNotify>
          (Replacer *this,AtomicNotify *curr,Index ptrIdx,Index bytes)

{
  BinaryOp BVar1;
  ulong uVar2;
  Expression *pEVar3;
  Const *pCVar4;
  Binary *this_00;
  
  uVar2 = (this->parent->pointerType).id;
  if (uVar2 < 7) {
    BVar1 = *(BinaryOp *)(&DAT_00b89c38 + uVar2 * 4);
    pEVar3 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x18,8);
    pEVar3->_id = LocalGetId;
    pEVar3[1]._id = ptrIdx;
    (pEVar3->type).id = uVar2;
    pCVar4 = Builder::makeConstPtr
                       (&this->builder,(curr->offset).addr,(Type)(this->parent->pointerType).id);
    this_00 = (Binary *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x28,8);
    (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    this_00->op = BVar1;
    this_00->left = pEVar3;
    this_00->right = (Expression *)pCVar4;
    Binary::finalize(this_00);
    pCVar4 = Builder::makeConstPtr(&this->builder,(ulong)bytes,(Type)(this->parent->pointerType).id)
    ;
    pEVar3 = makeAddGtuMemoryTrap
                       (this,(Expression *)this_00,(Expression *)pCVar4,
                        (Name)(curr->memory).super_IString.str);
    return pEVar3;
  }
  __assert_fail("isBasic() && \"Basic type expected\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-type.h"
                ,0xc6,"BasicType wasm::Type::getBasic() const");
}

Assistant:

Expression* makePtrBoundsCheck(T* curr, Index ptrIdx, Index bytes) {
      Expression* boundsCheck = makeAddGtuMemoryTrap(
        builder.makeBinary(
          // ptr + offset (ea from wasm spec) + bit width
          Abstract::getBinary(parent.pointerType, Abstract::Add),
          builder.makeLocalGet(ptrIdx, parent.pointerType),
          builder.makeConstPtr(curr->offset, parent.pointerType)),
        builder.makeConstPtr(bytes, parent.pointerType),
        curr->memory);
      return boundsCheck;
    }